

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

int xmlTextReaderMoveToElement(xmlTextReaderPtr reader)

{
  int iVar1;
  
  iVar1 = -1;
  if ((((reader != (xmlTextReaderPtr)0x0) && (reader->node != (xmlNodePtr)0x0)) &&
      (iVar1 = 0, reader->node->type == XML_ELEMENT_NODE)) && (reader->curnode != (xmlNodePtr)0x0))
  {
    reader->curnode = (xmlNodePtr)0x0;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int
xmlTextReaderMoveToElement(xmlTextReaderPtr reader) {
    if (reader == NULL)
	return(-1);
    if (reader->node == NULL)
	return(-1);
    if (reader->node->type != XML_ELEMENT_NODE)
	return(0);
    if (reader->curnode != NULL) {
	reader->curnode = NULL;
	return(1);
    }
    return(0);
}